

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  ColourImpl *pCVar3;
  ostream *os;
  pointer pMVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  byte bVar9;
  long lVar10;
  AssertionStats *pAVar11;
  char *pcVar12;
  char *pcVar13;
  pointer pMVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  long local_b0;
  char local_a1;
  string local_a0;
  Column local_80;
  char *local_40;
  long local_38;
  
  pAVar11 = _assertionStats;
  iVar6 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  bVar9 = 1;
  if ((char)iVar6 == '\0') {
    bVar9 = ((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(_assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  if (((bVar9 == 0) &&
      (OVar2 = (_assertionStats->assertionResult).m_resultData.resultType, OVar2 != ExplicitSkip))
     && (OVar2 != Warning)) {
    return;
  }
  TablePrinter::close((this->m_tablePrinter).m_ptr,(int)pAVar11);
  lazyPrintWithoutClosingBenchmarkTable(this);
  pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  OVar2 = (_assertionStats->assertionResult).m_resultData.resultType;
  uVar15 = 0;
  uVar16 = 0;
  local_40 = "";
  if (0x10f < OVar2) {
    if (ThrewException < OVar2) {
      if (OVar2 == DidntThrowException) {
        local_40 = "because no exception was thrown where one was expected";
        local_38 = 0x36;
      }
      else {
        pcVar13 = "";
        local_b0 = 0;
        local_38 = 0;
        if (OVar2 != FatalErrorCondition) goto LAB_0015390f;
        local_40 = "due to a fatal error condition";
        local_38 = 0x1e;
      }
      goto LAB_001538f8;
    }
    if (OVar2 != Exception) {
      pcVar13 = "";
      local_b0 = 0;
      local_38 = 0;
      uVar16 = uVar15;
      if (OVar2 == ThrewException) {
        lVar7 = ((long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
        local_b0 = 6;
        uVar16 = 0x12;
        pcVar13 = "FAILED";
        if (lVar7 == 0) {
          local_40 = "due to unexpected exception with ";
          local_38 = 0x21;
        }
        else if (lVar7 == 1) {
          local_40 = "due to unexpected exception with message";
          local_38 = 0x28;
        }
        else {
          local_40 = "due to unexpected exception with messages";
          local_38 = 0x29;
        }
      }
      goto LAB_0015390f;
    }
switchD_001535f0_caseD_ffffffff:
    local_b0 = 0x14;
    uVar15 = 0x12;
    pcVar13 = "** internal error **";
LAB_00153708:
    local_38 = 0;
    uVar16 = uVar15;
    goto LAB_0015390f;
  }
  switch(OVar2) {
  case Ok:
    lVar7 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar13 = "";
    if (lVar7 == 0x48) {
      pcVar13 = "with message";
    }
    lVar10 = 0xc;
    if (lVar7 != 0x48) {
      lVar10 = 0;
    }
    bVar5 = (ulong)((lVar7 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_40 = "with messages";
    if (bVar5) {
      local_40 = pcVar13;
    }
    local_38 = 0xd;
    if (bVar5) {
      local_38 = lVar10;
    }
    local_b0 = 6;
    uVar16 = 3;
    pcVar13 = "PASSED";
    break;
  case Info:
    local_38 = 4;
    local_40 = "info";
    goto LAB_00153869;
  case Warning:
    local_38 = 7;
    local_40 = "warning";
LAB_00153869:
    pcVar13 = "";
    uVar16 = 0;
    local_b0 = 0;
    break;
  default:
    local_b0 = 0;
    pcVar13 = local_40;
    goto LAB_00153708;
  case ExplicitSkip:
    lVar7 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar13 = "";
    if (lVar7 == 0x48) {
      pcVar13 = "explicitly with message";
    }
    lVar10 = 0x17;
    if (lVar7 != 0x48) {
      lVar10 = 0;
    }
    bVar5 = (ulong)((lVar7 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_40 = "explicitly with messages";
    if (bVar5) {
      local_40 = pcVar13;
    }
    local_38 = 0x18;
    if (bVar5) {
      local_38 = lVar10;
    }
    local_b0 = 7;
    uVar16 = 0x17;
    pcVar13 = "SKIPPED";
    break;
  case ExpressionFailed:
    bVar17 = (OVar2 & FailureBit) == Ok;
    bVar5 = (char)(((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) >> 3
                  ) != '\0';
    pcVar13 = "FAILED";
    if (bVar5 || bVar17) {
      pcVar13 = "FAILED - but was ok";
    }
    uVar16 = 0x12;
    if (bVar5 || bVar17) {
      uVar16 = 3;
    }
    local_b0 = 6;
    if (bVar5 || bVar17) {
      local_b0 = 0x13;
    }
    lVar7 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = "";
    if (lVar7 == 0x48) {
      pcVar12 = "with message";
    }
    lVar10 = 0xc;
    if (lVar7 != 0x48) {
      lVar10 = 0;
    }
    bVar5 = (ulong)((lVar7 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_40 = "with messages";
    if (bVar5) {
      local_40 = pcVar12;
    }
    local_38 = 0xd;
    if (bVar5) {
      local_38 = lVar10;
    }
    break;
  case ExplicitFailure:
    lVar7 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar13 = "";
    if (lVar7 == 0x48) {
      pcVar13 = "explicitly with message";
    }
    lVar10 = 0x17;
    if (lVar7 != 0x48) {
      lVar10 = 0;
    }
    bVar5 = (ulong)((lVar7 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_40 = "explicitly with messages";
    if (bVar5) {
      local_40 = pcVar13;
    }
    local_38 = 0x18;
    if (bVar5) {
      local_38 = lVar10;
    }
LAB_001538f8:
    local_b0 = 6;
    uVar16 = 0x12;
    pcVar13 = "FAILED";
    break;
  case Unknown:
  case FailureBit:
    goto switchD_001535f0_caseD_ffffffff;
  }
LAB_0015390f:
  os = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x17);
  local_80.m_string.m_string._M_dataplus._M_p =
       (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_80.m_string.m_string._M_string_length =
       (_assertionStats->assertionResult).m_info.lineInfo.line;
  operator<<(os,(SourceLineInfo *)&local_80);
  std::__ostream_insert<char,std::char_traits<char>>(os,": ",2);
  (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
  if ((_assertionStats->totals).assertions.failed + (_assertionStats->totals).assertions.passed +
      (_assertionStats->totals).assertions.failedButOk +
      (_assertionStats->totals).assertions.skipped == 0) {
    local_80.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_80,1);
  }
  else {
    if (local_b0 != 0) {
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,(ulong)uVar16);
      poVar8 = (ostream *)std::ostream::write((char *)os,(long)pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n",2);
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    }
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,5);
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_
                ((string *)&local_80,&_assertionStats->assertionResult);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_80.m_string.m_string._M_dataplus._M_p,
                          local_80.m_string.m_string._M_string_length);
      local_a0._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a0,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_string.m_string._M_dataplus._M_p != &local_80.m_string.m_string.field_2) {
        operator_delete(local_80.m_string.m_string._M_dataplus._M_p,
                        local_80.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    }
    bVar5 = AssertionResult::hasExpandedExpression(&_assertionStats->assertionResult);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"with expansion:\n",0x10);
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x16);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_a0,&_assertionStats->assertionResult)
      ;
      paVar1 = &local_80.m_string.m_string.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
        local_80.m_string.m_string.field_2._8_8_ = local_a0.field_2._8_8_;
        local_80.m_string.m_string._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_80.m_string.m_string._M_dataplus._M_p = local_a0._M_dataplus._M_p;
      }
      local_80.m_string.m_string.field_2._M_allocated_capacity._1_7_ =
           local_a0.field_2._M_allocated_capacity._1_7_;
      local_80.m_string.m_string.field_2._M_local_buf[0] = local_a0.field_2._M_local_buf[0];
      local_80.m_string.m_string._M_string_length = local_a0._M_string_length;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_80.m_string.m_size = 0;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      TextFlow::AnsiSkippingString::preprocessString(&local_80.m_string);
      local_80.m_width = 0x4f;
      local_80.m_initialIndent = 0xffffffffffffffff;
      local_80.m_indent = 2;
      TextFlow::operator<<(os,&local_80);
      local_a1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_a1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_string.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.m_string.m_string._M_dataplus._M_p,
                        local_80.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    }
  }
  if (local_38 != 0) {
    poVar8 = (ostream *)std::ostream::write((char *)os,(long)local_40);
    local_80.m_string.m_string._M_dataplus._M_p._0_1_ = 0x3a;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_80,1);
    local_80.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_80,1);
  }
  pMVar14 = (_assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar4 = (_assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar14 != pMVar4) {
    do {
      if ((pMVar14->type != Info | bVar9) == 1) {
        TextFlow::Column::Column(&local_80,&pMVar14->message);
        local_80.m_indent = 2;
        TextFlow::operator<<(os,&local_80);
        local_a0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_a0,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.m_string.m_string._M_dataplus._M_p != &local_80.m_string.m_string.field_2) {
          operator_delete(local_80.m_string.m_string._M_dataplus._M_p,
                          local_80.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar14 = pMVar14 + 1;
    } while (pMVar14 != pMVar4);
  }
  local_80.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,(char *)&local_80,1);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    // TODO: Make configurable whether skips should be printed
    if (!includeResults && result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip)
        return;

    lazyPrint();

    ConsoleAssertionPrinter printer(m_stream, _assertionStats, m_colour.get(), includeResults);
    printer.print();
    m_stream << '\n' << std::flush;
}